

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall UiWindow::UiWindow(UiWindow *this,Image *image,string *title)

{
  this->_vptr_UiWindow = (_func_int **)&PTR__UiWindow_0011fc88;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&this->_image,image);
  std::__cxx11::string::string((string *)&this->_title,(string *)title);
  this->_shown = false;
  return;
}

Assistant:

UiWindow::UiWindow( const PenguinV_Image::Image & image, const std::string & title )
    : _image( image )
    , _title( title )
    , _shown( false )
{
}